

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

int secp256k1_scalar_reduce(secp256k1_scalar *r,uint overflow)

{
  uint64_t uVar1;
  uint in_ESI;
  uint64_t *in_RDI;
  secp256k1_uint128 t;
  secp256k1_uint128 sStack_28;
  uint local_c;
  uint64_t *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  secp256k1_u128_from_u64(&sStack_28,*in_RDI);
  secp256k1_u128_accum_u64(&sStack_28,(ulong)local_c * 0x402da1732fc9bebf);
  uVar1 = secp256k1_u128_to_u64(&sStack_28);
  *local_8 = uVar1;
  secp256k1_u128_rshift(&sStack_28,0x40);
  secp256k1_u128_accum_u64(&sStack_28,local_8[1]);
  secp256k1_u128_accum_u64(&sStack_28,(ulong)local_c * 0x4551231950b75fc4);
  uVar1 = secp256k1_u128_to_u64(&sStack_28);
  local_8[1] = uVar1;
  secp256k1_u128_rshift(&sStack_28,0x40);
  secp256k1_u128_accum_u64(&sStack_28,local_8[2]);
  secp256k1_u128_accum_u64(&sStack_28,(ulong)local_c);
  uVar1 = secp256k1_u128_to_u64(&sStack_28);
  local_8[2] = uVar1;
  secp256k1_u128_rshift(&sStack_28,0x40);
  secp256k1_u128_accum_u64(&sStack_28,local_8[3]);
  uVar1 = secp256k1_u128_to_u64(&sStack_28);
  local_8[3] = uVar1;
  return local_c;
}

Assistant:

SECP256K1_INLINE static int secp256k1_scalar_reduce(secp256k1_scalar *r, unsigned int overflow) {
    secp256k1_uint128 t;
    VERIFY_CHECK(overflow <= 1);
    secp256k1_u128_from_u64(&t, r->d[0]);
    secp256k1_u128_accum_u64(&t, overflow * SECP256K1_N_C_0);
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1]);
    secp256k1_u128_accum_u64(&t, overflow * SECP256K1_N_C_1);
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2]);
    secp256k1_u128_accum_u64(&t, overflow * SECP256K1_N_C_2);
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3]);
    r->d[3] = secp256k1_u128_to_u64(&t);
    return overflow;
}